

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

void __thiscall
expression_tree::detail::
default_branch<float,_expression_tree::no_caching,_expression_tree::sequential>::default_branch
          (default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this,
          operation<float> *f,node_t *l,node_t *r)

{
  node_t *r_local;
  node_t *l_local;
  operation<float> *f_local;
  default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this_local;
  
  node_impl<float>::node_impl(&this->super_node_impl<float>);
  (this->super_node_impl<float>)._vptr_node_impl = (_func_int **)&PTR__default_branch_00168c98;
  node<float,_expression_tree::no_caching,_expression_tree::sequential>::node(&this->l,l);
  node<float,_expression_tree::no_caching,_expression_tree::sequential>::node(&this->r,r);
  std::function<float_(const_float_&,_const_float_&)>::function(&this->f,f);
  this->constant_ = indeterminate;
  return;
}

Assistant:

default_branch(const operation<T>& f, const node_t& l, const node_t& r) : l(l), r(r), f(f), constant_(indeterminate) {}